

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5ImagesArrayIndexing.cpp
# Opt level: O0

void __thiscall glcts::GPUShader5ImagesArrayIndexing::deinit(GPUShader5ImagesArrayIndexing *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GPUShader5ImagesArrayIndexing *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1680))(0);
  (**(code **)(lVar3 + 0x40))(0x8892,0);
  (**(code **)(lVar3 + 8))(0x84c0);
  (**(code **)(lVar3 + 0xb8))(0xde1,0);
  (**(code **)(lVar3 + 0xd8))(0);
  if (this->m_program_id != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_program_id);
    this->m_program_id = 0;
  }
  if (this->m_compute_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_compute_shader_id);
    this->m_compute_shader_id = 0;
  }
  if (this->m_data_buffer != (GLuint *)0x0) {
    if (this->m_data_buffer != (GLuint *)0x0) {
      operator_delete__(this->m_data_buffer);
    }
    this->m_data_buffer = (GLuint *)0x0;
  }
  if (this->m_to_ids != (GLuint *)0x0) {
    (**(code **)(lVar3 + 0x480))(4,this->m_to_ids);
    if (this->m_to_ids != (GLuint *)0x0) {
      operator_delete__(this->m_to_ids);
    }
    this->m_to_ids = (GLuint *)0x0;
  }
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GPUShader5ImagesArrayIndexing::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.bindVertexArray(0);

	/* Delete program object and shaders */
	if (m_program_id != 0)
	{
		gl.deleteProgram(m_program_id);

		m_program_id = 0;
	}

	if (m_compute_shader_id != 0)
	{
		gl.deleteShader(m_compute_shader_id);

		m_compute_shader_id = 0;
	}

	if (m_data_buffer != DE_NULL)
	{
		delete[] m_data_buffer;
		m_data_buffer = DE_NULL;
	}

	if (m_to_ids != DE_NULL)
	{
		gl.deleteTextures(m_array_size, m_to_ids);
		delete[] m_to_ids;
		m_to_ids = DE_NULL;
	}

	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);
		m_fbo_id = 0;
	}

	/* Call base class' deinit() */
	TestCaseBase::deinit();
}